

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O1

bool __thiscall QSQLiteDriver::beginTransaction(QSQLiteDriver *this)

{
  char cVar1;
  QSqlResult *pQVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QSqlQuery q;
  QString local_a8;
  QSqlError local_88 [8];
  QSqlError local_80 [8];
  QString local_78;
  undefined1 *local_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = (**(code **)(*(long *)this + 0x60))();
  if (cVar1 != '\0') {
    cVar1 = QSqlDriver::isOpenError();
    if (cVar1 == '\0') {
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar2 = (QSqlResult *)(**(code **)(*(long *)this + 200))(this);
      QSqlQuery::QSqlQuery((QSqlQuery *)&local_60,pQVar2);
      QVar3.m_data = (storage_type_conflict *)0x5;
      QVar3.m_size = (qsizetype)&local_58;
      QString::fromLatin1(QVar3);
      local_78.d.d = local_58.d.d;
      local_78.d.ptr = local_58.d.ptr;
      local_78.d.size = local_58.d.size;
      cVar1 = QSqlQuery::exec((QString *)&local_60);
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (cVar1 == '\0') {
        QMetaObject::tr((char *)&local_58,(char *)&staticMetaObject,0x20144d);
        QSqlQuery::lastError();
        QSqlError::databaseText();
        local_a8.d.d = (Data *)0x0;
        local_a8.d.ptr = (char16_t *)0x0;
        local_a8.d.size = 0;
        QSqlError::QSqlError(local_80,&local_58,&local_78,TransactionError,&local_a8);
        (**(code **)(*(long *)this + 0x120))(this,local_80);
        QSqlError::~QSqlError(local_80);
        if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        QSqlError::~QSqlError(local_88);
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      QSqlQuery::~QSqlQuery((QSqlQuery *)&local_60);
      goto LAB_0011567c;
    }
  }
  cVar1 = '\0';
LAB_0011567c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)cVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QSQLiteDriver::beginTransaction()
{
    if (!isOpen() || isOpenError())
        return false;

    QSqlQuery q(createResult());
    if (!q.exec("BEGIN"_L1)) {
        setLastError(QSqlError(tr("Unable to begin transaction"),
                               q.lastError().databaseText(), QSqlError::TransactionError));
        return false;
    }

    return true;
}